

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

void Gia_ManEdgeFromArray(Gia_Man_t *p,Vec_Int_t *vArray)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    piVar7 = p->vEdge1->pArray;
    if (piVar7 != (int *)0x0) {
      free(piVar7);
      p->vEdge1->pArray = (int *)0x0;
    }
    if (p->vEdge1 != (Vec_Int_t *)0x0) {
      free(p->vEdge1);
      p->vEdge1 = (Vec_Int_t *)0x0;
    }
  }
  if (p->vEdge2 != (Vec_Int_t *)0x0) {
    piVar7 = p->vEdge2->pArray;
    if (piVar7 != (int *)0x0) {
      free(piVar7);
      p->vEdge2->pArray = (int *)0x0;
    }
    if (p->vEdge2 != (Vec_Int_t *)0x0) {
      free(p->vEdge2);
      p->vEdge2 = (Vec_Int_t *)0x0;
    }
  }
  iVar1 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar10;
  if (iVar10 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar10 * 4);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = iVar1;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0,(long)iVar1 * 4);
  }
  p->vEdge1 = pVVar6;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar10;
  if (iVar10 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar10 << 2);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  p->vEdge2 = pVVar8;
  iVar1 = vArray->nSize;
  iVar10 = 0;
  if (1 < iVar1) {
    piVar4 = vArray->pArray;
    iVar10 = 0;
    lVar9 = 1;
    do {
      uVar2 = piVar4[lVar9 + -1];
      uVar3 = piVar4[lVar9];
      if ((int)uVar3 <= (int)uVar2) {
        __assert_fail("iObj1 < iObj2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                      ,0x51,"void Gia_ManEdgeFromArray(Gia_Man_t *, Vec_Int_t *)");
      }
      if (((int)uVar2 < 0) || (pVVar6->nSize <= (int)uVar2)) goto LAB_001f6c3d;
      piVar5 = piVar7;
      if (piVar7[uVar2] == 0) {
LAB_001f6bb9:
        piVar5[uVar2] = uVar3;
        iVar11 = 0;
      }
      else {
        if (pVVar8->nSize <= (int)uVar2) goto LAB_001f6c3d;
        iVar11 = 1;
        piVar5 = __s;
        if (__s[uVar2] == 0) goto LAB_001f6bb9;
      }
      if (((int)uVar3 < 0) || (pVVar6->nSize <= (int)uVar3)) {
LAB_001f6c3d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = piVar7;
      if (piVar7[uVar3] == 0) {
LAB_001f6bf6:
        piVar5[uVar3] = uVar2;
        iVar12 = 0;
      }
      else {
        if (pVVar8->nSize <= (int)uVar3) goto LAB_001f6c3d;
        iVar12 = 1;
        piVar5 = __s;
        if (__s[uVar3] == 0) goto LAB_001f6bf6;
      }
      iVar10 = iVar10 + iVar11 + iVar12;
      lVar9 = lVar9 + 2;
    } while ((int)lVar9 < iVar1);
  }
  if (iVar10 == 0) {
    return;
  }
  printf("Found %d violations during edge conversion.\n");
  return;
}

Assistant:

void Gia_ManEdgeFromArray( Gia_Man_t * p, Vec_Int_t * vArray )
{
    int i, iObj1, iObj2, Count = 0;
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntForEachEntryDouble( vArray, iObj1, iObj2, i )
    {
        assert( iObj1 < iObj2 );
        Count += Gia_ObjEdgeAdd( iObj1, iObj2, p->vEdge1, p->vEdge2 );
        Count += Gia_ObjEdgeAdd( iObj2, iObj1, p->vEdge1, p->vEdge2 );
    }
    if ( Count ) 
        printf( "Found %d violations during edge conversion.\n", Count );
}